

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O0

char * __thiscall Analyzer::getFunctionName(Analyzer *this,Node *node)

{
  reference ppNVar1;
  long in_RSI;
  char *functionName;
  Node *functionNameNode;
  value_type local_20;
  char *local_8;
  
  if ((*(int *)(in_RSI + 0x10) == 0x17) || (*(int *)(in_RSI + 0x10) == 0x18)) {
    ppNVar1 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                        ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RSI + 0x18),0);
    local_20 = *ppNVar1;
    if (local_20 != (value_type)0x0) {
      if ((local_20->nodeType == PNT_ACCESS_MEMBER) ||
         (local_20->nodeType == PNT_ACCESS_MEMBER_IF_NOT_NULL)) {
        ppNVar1 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&local_20->children,1);
        local_20 = *ppNVar1;
      }
      if (local_20->nodeType == PNT_IDENTIFIER) {
        return (char *)(local_20->tok->u).d;
      }
    }
  }
  local_8 = "";
  return local_8;
}

Assistant:

const char * getFunctionName(Node * node)
  {
    if (node->nodeType == PNT_FUNCTION_CALL || node->nodeType == PNT_FUNCTION_CALL_IF_NOT_NULL)
    {
      Node * functionNameNode = node->children[0];

      if (functionNameNode)
      {
        if (functionNameNode->nodeType == PNT_ACCESS_MEMBER || functionNameNode->nodeType == PNT_ACCESS_MEMBER_IF_NOT_NULL)
          functionNameNode = functionNameNode->children[1];

        if (functionNameNode->nodeType == PNT_IDENTIFIER)
        {
          const char * functionName = functionNameNode->tok.u.s;
          return functionName;
        }
      }
    }

    return "";
  }